

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::recoversubfaces(tetgenmesh *this,arraypool *misshlist,int steinerflag)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  point pdVar6;
  char *pcVar7;
  uint local_18c;
  face *local_168;
  int local_160;
  int local_15c;
  int j;
  int i;
  int t1ver;
  int success;
  insertvertexflags ivf;
  point steinerpt;
  point *parypt;
  point apexpt;
  point endpt;
  point startpt;
  face bdsegs [3];
  face *parysh;
  face neineish;
  face neighsh;
  face searchsh;
  triface spintet;
  triface neightet;
  triface searchtet;
  int steinerflag_local;
  arraypool *misshlist_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)&spintet.ver);
  triface::triface((triface *)&searchsh.shver);
  face::face((face *)&neighsh.shver);
  face::face((face *)&neineish.shver);
  face::face((face *)&parysh);
  local_168 = (face *)&startpt;
  do {
    face::face(local_168);
    local_168 = local_168 + 1;
  } while (local_168 != (face *)&bdsegs[2].shver);
  insertvertexflags::insertvertexflags((insertvertexflags *)&t1ver);
  if (1 < this->b->verbose) {
    pcVar7 = "auto";
    if (0 < this->b->fliplinklevel) {
      pcVar7 = "fixed";
    }
    if (this->b->fliplinklevel < 1) {
      local_18c = this->autofliplinklevel;
    }
    else {
      local_18c = this->b->fliplinklevel;
    }
    printf("    Recover subfaces [%s level = %2d] #:  %ld.\n",pcVar7,(ulong)local_18c,
           this->subfacstack->objects);
  }
LAB_0014f8dd:
  do {
    if (this->subfacstack->objects < 1) {
      return 0;
    }
    this->subfacstack->objects = this->subfacstack->objects + -1;
    bdsegs[2]._8_8_ =
         this->subfacstack->toparray
         [this->subfacstack->objects >> ((byte)this->subfacstack->log2objectsperblock & 0x3f)] +
         (this->subfacstack->objects & (long)this->subfacstack->objectsperblockmark) *
         (long)this->subfacstack->objectbytes;
    face::operator=((face *)&neighsh.shver,(face *)bdsegs[2]._8_8_);
  } while ((*(long *)(neighsh._8_8_ + 0x18) == 0) ||
          (stpivot(this,(face *)&neighsh.shver,(triface *)&spintet.ver), spintet._8_8_ != 0));
  if (2 < this->b->verbose) {
    pdVar6 = sorg(this,(face *)&neighsh.shver);
    uVar2 = pointmark(this,pdVar6);
    pdVar6 = sdest(this,(face *)&neighsh.shver);
    uVar3 = pointmark(this,pdVar6);
    pdVar6 = sapex(this,(face *)&neighsh.shver);
    uVar4 = pointmark(this,pdVar6);
    printf("      Recover subface (%d, %d, %d).\n",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  }
  for (local_15c = 0; local_15c < 3; local_15c = local_15c + 1) {
    sspivot(this,(face *)&neighsh.shver,(face *)&bdsegs[(long)local_15c + -1].shver);
    if (*(long *)&bdsegs[(long)local_15c + -1].shver == 0) {
      endpt = sorg(this,(face *)&neighsh.shver);
      apexpt = sdest(this,(face *)&neighsh.shver);
      point2tetorg(this,endpt,(triface *)&neightet.ver);
      finddirection(this,(triface *)&neightet.ver,apexpt);
      pdVar6 = dest(this,(triface *)&neightet.ver);
      if (pdVar6 == apexpt) {
        bVar1 = true;
      }
      else {
        iVar5 = recoveredgebyflips(this,endpt,apexpt,(face *)&neighsh.shver,(triface *)&neightet.ver
                                   ,0);
        if (iVar5 == 0) {
          iVar5 = recoveredgebyflips(this,apexpt,endpt,(face *)&neighsh.shver,
                                     (triface *)&neightet.ver,0);
          bVar1 = iVar5 != 0;
        }
        else {
          bVar1 = true;
        }
      }
      local_160 = local_15c;
      if (!bVar1) goto LAB_0014fdc5;
      makeshellface(this,this->subsegs,(face *)&bdsegs[(long)local_15c + -1].shver);
      setsorg(this,(face *)&bdsegs[(long)local_15c + -1].shver,endpt);
      setsdest(this,(face *)&bdsegs[(long)local_15c + -1].shver,apexpt);
      setsapex(this,(face *)&bdsegs[(long)local_15c + -1].shver,(point)0x0);
      smarktest2(this,(face *)&bdsegs[(long)local_15c + -1].shver);
      ssbond(this,(face *)&neighsh.shver,(face *)&bdsegs[(long)local_15c + -1].shver);
      spivot(this,(face *)&neighsh.shver,(face *)&neineish.shver);
      if (neineish._8_8_ != 0) {
        ssbond(this,(face *)&neineish.shver,(face *)&bdsegs[(long)local_15c + -1].shver);
      }
      sstbond1(this,(face *)&bdsegs[(long)local_15c + -1].shver,(triface *)&neightet.ver);
      triface::operator=((triface *)&searchsh.shver,(triface *)&neightet.ver);
      do {
        tssbond1(this,(triface *)&searchsh.shver,(face *)&bdsegs[(long)local_15c + -1].shver);
        iVar5 = (int)spintet.tet;
        decode(this,*(tetrahedron *)(searchsh._8_8_ + (long)facepivot1[(int)spintet.tet] * 8),
               (triface *)&searchsh.shver);
        spintet.tet._0_4_ = facepivot2[iVar5][(int)spintet.tet];
      } while (searchsh._8_8_ != neightet._8_8_);
    }
    else {
      sstpivot1(this,(face *)&bdsegs[(long)local_15c + -1].shver,(triface *)&neightet.ver);
      if (neightet._8_8_ == 0) {
        terminatetetgen(this,2);
      }
    }
    senextself(this,(face *)&neighsh.shver);
  }
  goto LAB_00150170;
LAB_0014fdc5:
  while (local_160 = local_160 + -1, -1 < local_160) {
    bVar1 = smarktest2ed(this,(face *)&bdsegs[(long)local_160 + -1].shver);
    if (bVar1) {
      spivot(this,(face *)&bdsegs[(long)local_160 + -1].shver,(face *)&parysh);
      ssdissolve(this,(face *)&parysh);
      spivot(this,(face *)&parysh,(face *)&neineish.shver);
      if (neineish._8_8_ != 0) {
        ssdissolve(this,(face *)&neineish.shver);
      }
      sstpivot1(this,(face *)&bdsegs[(long)local_160 + -1].shver,(triface *)&neightet.ver);
      triface::operator=((triface *)&searchsh.shver,(triface *)&neightet.ver);
      do {
        tssdissolve1(this,(triface *)&searchsh.shver);
        iVar5 = (int)spintet.tet;
        decode(this,*(tetrahedron *)(searchsh._8_8_ + (long)facepivot1[(int)spintet.tet] * 8),
               (triface *)&searchsh.shver);
        spintet.tet._0_4_ = facepivot2[iVar5][(int)spintet.tet];
      } while (searchsh._8_8_ != neightet._8_8_);
      shellfacedealloc(this,this->subsegs,*(shellface **)&bdsegs[(long)local_160 + -1].shver);
    }
  }
  if (steinerflag != 0) {
    if (2 < this->b->verbose) {
      uVar2 = pointmark(this,endpt);
      uVar3 = pointmark(this,apexpt);
      printf("      Add a Steiner point in subedge (%d, %d).\n",(ulong)uVar2,(ulong)uVar3);
    }
    makepoint(this,&ivf.parentpt,FREEFACETVERTEX);
    for (local_160 = 0; local_160 < 3; local_160 = local_160 + 1) {
      ivf.parentpt[local_160] = (endpt[local_160] + apexpt[local_160]) * 0.5;
    }
    point2tetorg(this,endpt,(triface *)&neightet.ver);
    t1ver = 1;
    success = 1;
    ivf.iloc = 0;
    ivf.validflag = 0;
    ivf.respectbdflag = 0;
    ivf.cdtflag = 4;
    ivf.assignmeshsize = 1;
    ivf.bowywat = 0;
    ivf.lawson = 1;
    ivf.splitbdflag = 1;
    ivf.chkencflag = this->b->metric;
    iVar5 = insertpoint(this,ivf.parentpt,(triface *)&neightet.ver,(face *)&neighsh.shver,
                        (face *)0x0,(insertvertexflags *)&t1ver);
    if (iVar5 == 0) {
      terminatetetgen(this,2);
    }
    arraypool::newindex(this->subvertstack,&steinerpt);
    *steinerpt = (double)ivf.parentpt;
    this->st_facref_count = this->st_facref_count + 1;
    if (0 < this->steinerleft) {
      this->steinerleft = this->steinerleft + -1;
    }
  }
LAB_00150170:
  if (local_15c == 3) {
    endpt = sorg(this,(face *)&neighsh.shver);
    apexpt = sdest(this,(face *)&neighsh.shver);
    parypt = (point *)sapex(this,(face *)&neighsh.shver);
    i = recoverfacebyflips(this,endpt,apexpt,(point)parypt,(face *)&neighsh.shver,
                           (triface *)&neightet.ver);
    for (local_160 = 0; local_160 < 3; local_160 = local_160 + 1) {
      bVar1 = smarktest2ed(this,(face *)&bdsegs[(long)local_160 + -1].shver);
      if (bVar1) {
        spivot(this,(face *)&bdsegs[(long)local_160 + -1].shver,(face *)&parysh);
        ssdissolve(this,(face *)&parysh);
        spivot(this,(face *)&parysh,(face *)&neineish.shver);
        if (neineish._8_8_ != 0) {
          ssdissolve(this,(face *)&neineish.shver);
        }
        sstpivot1(this,(face *)&bdsegs[(long)local_160 + -1].shver,(triface *)&spintet.ver);
        triface::operator=((triface *)&searchsh.shver,(triface *)&spintet.ver);
        do {
          tssdissolve1(this,(triface *)&searchsh.shver);
          iVar5 = (int)spintet.tet;
          decode(this,*(tetrahedron *)(searchsh._8_8_ + (long)facepivot1[(int)spintet.tet] * 8),
                 (triface *)&searchsh.shver);
          spintet.tet._0_4_ = facepivot2[iVar5][(int)spintet.tet];
        } while (searchsh._8_8_ != spintet._8_8_);
        shellfacedealloc(this,this->subsegs,*(shellface **)&bdsegs[(long)local_160 + -1].shver);
      }
    }
    if (i == 0) {
      if (steinerflag != 0) {
        if (2 < this->b->verbose) {
          uVar2 = pointmark(this,endpt);
          uVar3 = pointmark(this,apexpt);
          uVar4 = pointmark(this,(point)parypt);
          printf("      Add a Steiner point in subface (%d, %d, %d).\n",(ulong)uVar2,(ulong)uVar3,
                 (ulong)uVar4);
        }
        makepoint(this,&ivf.parentpt,FREEFACETVERTEX);
        for (local_160 = 0; local_160 < 3; local_160 = local_160 + 1) {
          ivf.parentpt[local_160] =
               (endpt[local_160] + apexpt[local_160] + (double)parypt[local_160]) / 3.0;
        }
        point2tetorg(this,endpt,(triface *)&neightet.ver);
        t1ver = 1;
        success = 1;
        ivf.iloc = 0;
        ivf.validflag = 0;
        ivf.respectbdflag = 0;
        ivf.cdtflag = 3;
        ivf.assignmeshsize = 1;
        ivf.bowywat = 0;
        ivf.lawson = 1;
        ivf.splitbdflag = 1;
        ivf.chkencflag = this->b->metric;
        iVar5 = insertpoint(this,ivf.parentpt,(triface *)&neightet.ver,(face *)&neighsh.shver,
                            (face *)0x0,(insertvertexflags *)&t1ver);
        if (iVar5 == 0) {
          terminatetetgen(this,2);
        }
        arraypool::newindex(this->subvertstack,&steinerpt);
        *steinerpt = (double)ivf.parentpt;
        this->st_facref_count = this->st_facref_count + 1;
        if (0 < this->steinerleft) {
          this->steinerleft = this->steinerleft + -1;
        }
      }
    }
    else if (neighsh._8_8_ != 0) {
      tsbond(this,(triface *)&neightet.ver,(face *)&neighsh.shver);
      decode(this,*(tetrahedron *)(neightet._8_8_ + (long)(int)((uint)searchtet.tet & 3) * 8),
             (triface *)&neightet.ver);
      searchtet.tet._0_4_ = fsymtbl[(int)(uint)searchtet.tet][(int)(uint)searchtet.tet];
      sesymself(this,(face *)&neighsh.shver);
      tsbond(this,(triface *)&neightet.ver,(face *)&neighsh.shver);
    }
  }
  else {
    i = 0;
  }
  if ((i == 0) && (misshlist != (arraypool *)0x0)) {
    arraypool::newindex(misshlist,(void **)&bdsegs[2].shver);
    face::operator=((face *)bdsegs[2]._8_8_,(face *)&neighsh.shver);
  }
  goto LAB_0014f8dd;
}

Assistant:

int tetgenmesh::recoversubfaces(arraypool *misshlist, int steinerflag)
{
  triface searchtet, neightet, spintet;
  face searchsh, neighsh, neineish, *parysh;
  face bdsegs[3];
  point startpt, endpt, apexpt, *parypt;
  point steinerpt;
  insertvertexflags ivf;
  int success;
  int t1ver;
  int i, j;

  if (b->verbose > 1) {
    printf("    Recover subfaces [%s level = %2d] #:  %ld.\n",
           (b->fliplinklevel > 0) ? "fixed" : "auto",
           (b->fliplinklevel > 0) ? b->fliplinklevel : autofliplinklevel,
           subfacstack->objects);
  }

  // Loop until 'subfacstack' is empty.
  while (subfacstack->objects > 0l) {

    subfacstack->objects--;
    parysh = (face *) fastlookup(subfacstack, subfacstack->objects);
    searchsh = *parysh;

    if (searchsh.sh[3] == NULL) continue; // Skip a dead subface.

    stpivot(searchsh, neightet);
    if (neightet.tet != NULL) continue; // Skip a recovered subface.


    if (b->verbose > 2) {
      printf("      Recover subface (%d, %d, %d).\n",pointmark(sorg(searchsh)),
             pointmark(sdest(searchsh)), pointmark(sapex(searchsh)));
    }

    // The three edges of the face need to be existed first.
    for (i = 0; i < 3; i++) {
      sspivot(searchsh, bdsegs[i]);   
      if (bdsegs[i].sh != NULL) {
        // The segment must exist.
        sstpivot1(bdsegs[i], searchtet);
        if (searchtet.tet == NULL) {
          terminatetetgen(this, 2);
        }
      } else {
        // This edge is not a segment (due to a Steiner point).
        // Check whether it exists or not.
        success = 0;
        startpt = sorg(searchsh);
        endpt = sdest(searchsh);
        point2tetorg(startpt, searchtet);
        finddirection(&searchtet, endpt);
        if (dest(searchtet) == endpt) {
          success = 1;
        } else {
          // The edge is missing. Try to recover it.
          if (recoveredgebyflips(startpt, endpt, &searchsh, &searchtet, 0)) {
            success = 1;
          } else {
            if (recoveredgebyflips(endpt, startpt, &searchsh, &searchtet, 0)) {
              success = 1;
            }
          }
        }
        if (success) {
          // Insert a temporary segment to protect this edge.
          makeshellface(subsegs, &(bdsegs[i]));
          setshvertices(bdsegs[i], startpt, endpt, NULL);
          smarktest2(bdsegs[i]); // It's a temporary segment.
          // Insert this segment into surface mesh.
          ssbond(searchsh, bdsegs[i]);
          spivot(searchsh, neighsh);
          if (neighsh.sh != NULL) {
            ssbond(neighsh, bdsegs[i]);
          }
          // Insert this segment into tetrahedralization.
          sstbond1(bdsegs[i], searchtet);
          // Bond the segment to all tets containing it.
          spintet = searchtet;
          do {
            tssbond1(spintet, bdsegs[i]);
            fnextself(spintet);
          } while (spintet.tet != searchtet.tet);
        } else {
          // An edge of this subface is missing. Can't recover this subface.
          // Delete any temporary segment that has been created.
          for (j = (i - 1); j >= 0; j--) {
            if (smarktest2ed(bdsegs[j])) { 
              spivot(bdsegs[j], neineish);
                ssdissolve(neineish);
                spivot(neineish, neighsh);
                if (neighsh.sh != NULL) {
                  ssdissolve(neighsh);
                }
              sstpivot1(bdsegs[j], searchtet);
                spintet = searchtet;
                while (1) {
                  tssdissolve1(spintet);
                  fnextself(spintet);
                  if (spintet.tet == searchtet.tet) break;
                }
              shellfacedealloc(subsegs, bdsegs[j].sh);
            }
          } // j
          if (steinerflag) {
            // Add a Steiner point at the midpoint of this edge.
            if (b->verbose > 2) {
              printf("      Add a Steiner point in subedge (%d, %d).\n",
                     pointmark(startpt), pointmark(endpt));
            }
            makepoint(&steinerpt, FREEFACETVERTEX);
            for (j = 0; j < 3; j++) {
              steinerpt[j] = 0.5 * (startpt[j] + endpt[j]);
            }

            point2tetorg(startpt, searchtet); // Start from 'searchtet'.
            ivf.iloc = (int) OUTSIDE; // Need point location.
            ivf.bowywat = 1;
            ivf.lawson = 0;
            ivf.rejflag = 0;
            ivf.chkencflag = 0;
            ivf.sloc = (int) ONEDGE;            
            ivf.sbowywat = 1; // Allow flips in facet.
            ivf.splitbdflag = 0;
            ivf.validflag = 1;
            ivf.respectbdflag = 1;
            ivf.assignmeshsize = b->metric;
            if (!insertpoint(steinerpt, &searchtet, &searchsh, NULL, &ivf)) {
              terminatetetgen(this, 2);
            }
            // Save this Steiner point (for removal).
            //   Re-use the array 'subvertstack'.
            subvertstack->newindex((void **) &parypt);
            *parypt = steinerpt;

            st_facref_count++;
            if (steinerleft > 0) steinerleft--;
          } // if (steinerflag)
          break;
        }
      }
      senextself(searchsh);
    } // i

    if (i == 3) {
      // Recover the subface.
      startpt = sorg(searchsh);
      endpt   = sdest(searchsh);
      apexpt  = sapex(searchsh);

      success = recoverfacebyflips(startpt,endpt,apexpt,&searchsh,&searchtet);

      // Delete any temporary segment that has been created.
      for (j = 0; j < 3; j++) {
        if (smarktest2ed(bdsegs[j])) { 
          spivot(bdsegs[j], neineish);
            ssdissolve(neineish);
            spivot(neineish, neighsh);
            if (neighsh.sh != NULL) {
              ssdissolve(neighsh);
            }
          sstpivot1(bdsegs[j], neightet);
            spintet = neightet;
            while (1) {
              tssdissolve1(spintet);
              fnextself(spintet);
              if (spintet.tet == neightet.tet) break;
            }
          shellfacedealloc(subsegs, bdsegs[j].sh);
        }
      } // j

      if (success) {
        if (searchsh.sh != NULL) {
          // Face is recovered. Insert it.
          tsbond(searchtet, searchsh);
          fsymself(searchtet);
          sesymself(searchsh);
          tsbond(searchtet, searchsh);
        }
      } else {
        if (steinerflag) {
          // Add a Steiner point at the barycenter of this subface.
          if (b->verbose > 2) {
            printf("      Add a Steiner point in subface (%d, %d, %d).\n",
                   pointmark(startpt), pointmark(endpt), pointmark(apexpt));
          }
          makepoint(&steinerpt, FREEFACETVERTEX);
          for (j = 0; j < 3; j++) {
            steinerpt[j] = (startpt[j] + endpt[j] + apexpt[j]) / 3.0;
          }

          point2tetorg(startpt, searchtet); // Start from 'searchtet'.
          ivf.iloc = (int) OUTSIDE; // Need point location.
          ivf.bowywat = 1;
          ivf.lawson = 0;
          ivf.rejflag = 0;
          ivf.chkencflag = 0;
          ivf.sloc = (int) ONFACE;          
          ivf.sbowywat = 1; // Allow flips in facet.
          ivf.splitbdflag = 0;
          ivf.validflag = 1;
          ivf.respectbdflag = 1;
          ivf.assignmeshsize = b->metric; 
          if (!insertpoint(steinerpt, &searchtet, &searchsh, NULL, &ivf)) {
            terminatetetgen(this, 2);
          }
          // Save this Steiner point (for removal).
          //   Re-use the array 'subvertstack'.
          subvertstack->newindex((void **) &parypt);
          *parypt = steinerpt;

          st_facref_count++;
          if (steinerleft > 0) steinerleft--;
        } // if (steinerflag)
      }
    } else {
      success = 0;      
    }

    if (!success) {
      if (misshlist != NULL) {
        // Save this subface.
        misshlist->newindex((void **) &parysh);
        *parysh = searchsh;
      }
    }

  } // while (subfacstack->objects > 0l)

  return 0;
}